

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O3

void duckdb::BitpackingCompressionState<unsigned_long,_false,_long>::BitpackingWriter::WriteFor
               (unsigned_long *values,bool *validity,bitpacking_width_t width,
               unsigned_long frame_of_reference,idx_t count,void *data_ptr)

{
  atomic<unsigned_long> *paVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  unsigned_long uVar5;
  unsigned_long *puVar6;
  pointer pCVar7;
  idx_t iVar8;
  ulong uVar9;
  bitpacking_metadata_encoded_t encoded_value;
  ulong uVar10;
  ulong uVar11;
  unsigned_long *in;
  ulong uVar12;
  ulong uVar13;
  uint64_t local_138 [33];
  
  iVar8 = count;
  if ((count & 0x1f) != 0) {
    uVar5 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)count & 0x1f);
    iVar8 = (count - uVar5) + 0x20;
  }
  uVar12 = (ulong)width;
  uVar9 = iVar8 * uVar12 >> 3;
  FlushAndCreateSegmentIfFull
            ((BitpackingCompressionState<unsigned_long,_false,_long> *)data_ptr,uVar9 + 0x10,4);
  iVar2 = *(int *)((long)data_ptr + 0x40);
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid
            ((optional_ptr<duckdb::FileBuffer,_true> *)((long)data_ptr + 0x38));
  lVar4 = *(long *)((long)data_ptr + 0x48);
  iVar3 = *(int *)(*(long *)((long)data_ptr + 0x38) + 0x10);
  *(long *)((long)data_ptr + 0x48) = lVar4 + -4;
  *(uint *)(lVar4 + -4) = iVar2 - iVar3 | 0x5000000;
  puVar6 = *(unsigned_long **)((long)data_ptr + 0x40);
  *puVar6 = frame_of_reference;
  puVar6[1] = uVar12;
  puVar6 = puVar6 + 2;
  *(unsigned_long **)((long)data_ptr + 0x40) = puVar6;
  uVar10 = count & 0xffffffffffffffe0;
  if (uVar10 != 0) {
    uVar11 = 0;
    uVar13 = 0;
    in = values;
    do {
      duckdb_fastpforlib::fastpack(in,(uint32_t *)((uVar11 >> 3) + (long)puVar6),(uint)width);
      uVar13 = uVar13 + 0x20;
      in = in + 0x20;
      uVar11 = uVar11 + (ulong)width * 0x20;
    } while (uVar13 < uVar10);
  }
  if ((count & 0x1f) != 0) {
    uVar11 = (ulong)(((uint)count & 0x1f) << 3);
    switchD_01043a80::default((void *)((long)local_138 + uVar11),0,0x100 - uVar11);
    switchD_015de399::default(local_138,values + uVar10,uVar11);
    duckdb_fastpforlib::fastpack
              (local_138,(uint32_t *)((long)puVar6 + (uVar12 * uVar10 >> 3)),(uint)width);
  }
  *(long *)((long)data_ptr + 0x40) = *(long *)((long)data_ptr + 0x40) + uVar9;
  pCVar7 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
           operator->((unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>
                       *)((long)data_ptr + 0x20));
  LOCK();
  paVar1 = &(pCVar7->super_SegmentBase<duckdb::ColumnSegment>).count;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + count;
  UNLOCK();
  return;
}

Assistant:

static void WriteFor(T *values, bool *validity, bitpacking_width_t width, T frame_of_reference, idx_t count,
		                     void *data_ptr) {
			auto state = reinterpret_cast<BitpackingCompressionState<T, WRITE_STATISTICS> *>(data_ptr);

			auto bp_size = BitpackingPrimitives::GetRequiredSize(count, width);
			ReserveSpace(state, bp_size + 2 * sizeof(T));

			WriteMetaData(state, BitpackingMode::FOR);
			WriteData(state->data_ptr, frame_of_reference);
			WriteData(state->data_ptr, (T)width);

			BitpackingPrimitives::PackBuffer<T, false>(state->data_ptr, values, count, width);
			state->data_ptr += bp_size;

			UpdateStats(state, count);
		}